

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O3

int QMetaTypeIdQObject<QCborStreamReader,_512>::qt_metatype_id(void)

{
  QBasicAtomicInt QVar1;
  char *data;
  long in_FS_OFFSET;
  QByteArray local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1._q_value.super___atomic_base<int>._M_i =
       qt_metatype_id::metatype_id._q_value.super___atomic_base<int>._M_i;
  if ((__atomic_base<int>)qt_metatype_id::metatype_id._q_value.super___atomic_base<int>._M_i ==
      (__atomic_base<int>)0x0) {
    data = QMetaObject::className(&QCborStreamReader::staticMetaObject);
    QByteArray::QByteArray(&local_28,data,-1);
    QVar1._q_value.super___atomic_base<int>._M_i =
         (Type)qRegisterNormalizedMetaTypeImplementation<QCborStreamReader>(&local_28);
    if (&(local_28.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_28.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  qt_metatype_id::metatype_id._q_value.super___atomic_base<int>._M_i =
       QVar1._q_value.super___atomic_base<int>._M_i;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return (int)qt_metatype_id::metatype_id._q_value.super___atomic_base<int>._M_i;
}

Assistant:

static int qt_metatype_id()
    {
        Q_CONSTINIT static QBasicAtomicInt metatype_id = Q_BASIC_ATOMIC_INITIALIZER(0);
        if (const int id = metatype_id.loadAcquire())
            return id;
        const char *const cName = T::staticMetaObject.className();
        const int newId = qRegisterNormalizedMetaType<T>(cName);
        metatype_id.storeRelease(newId);
        return newId;
    }